

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * OpToStr_abi_cxx11_(string *__return_storage_ptr__,int op)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(op) {
  case 1:
    pcVar2 = "+";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "-";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "*";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "/";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "^";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "exp";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "log";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "nil";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "sin";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "cos";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "tan";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "cot";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string OpToStr(int op)
{
    switch (op) {
    case ADD:
        return "+";
    case SUB:
        return "-";
    case MUL:
        return "*";
    case DIV:
        return "/";
    case COS:
        return "cos";
    case SIN:
        return "sin";
    case TAN:
        return "tan";
    case COT:
        return "cot";
    case EXP:
        return "exp";
    case PWR:
        return "^";
    case LOG:
        return "log";
    default:
        return "nil";
    }
}